

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

Vector __thiscall
anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::point_at
          (Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this,double t)

{
  element_type *peVar1;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  Vector VVar2;
  shared_ptr<anurbs::NurbsCurveGeometry<2L>_> local_30;
  double local_20;
  double t_local;
  Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this_local;
  
  local_20 = t;
  this_local = this;
  Ref<anurbs::NurbsCurveGeometry<2L>_>::operator->
            ((Ref<anurbs::NurbsCurveGeometry<2L>_> *)&local_30);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_30);
  (*(peVar1->super_CurveBase<2L>)._vptr_CurveBase[5])(local_20,this);
  std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>::~shared_ptr(&local_30);
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       extraout_XMM0_Qa;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector point_at(const double t) const override
    {
        return m_curve_geometry->point_at(t);
    }